

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

BBox * __thiscall CMU462::Vertex::bounds(BBox *__return_storage_ptr__,Vertex *this)

{
  bool bVar1;
  pointer pHVar2;
  pointer pFVar3;
  _Self local_88;
  _List_const_iterator<CMU462::Halfedge> local_80;
  _List_node_base *local_78;
  BBox local_70;
  _List_const_iterator<CMU462::Face> local_28;
  FaceCIter f;
  HalfedgeCIter h;
  Vertex *this_local;
  BBox *box;
  
  BBox::BBox(__return_storage_ptr__);
  f._M_node = (_List_node_base *)halfedge(this);
  do {
    pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                       ((_List_const_iterator<CMU462::Halfedge> *)&f);
    local_28._M_node = (_List_node_base *)Halfedge::face(pHVar2);
    pFVar3 = std::_List_const_iterator<CMU462::Face>::operator->(&local_28);
    bVar1 = Face::isBoundary(pFVar3);
    if (!bVar1) {
      pFVar3 = std::_List_const_iterator<CMU462::Face>::operator->(&local_28);
      (*(pFVar3->super_HalfedgeElement)._vptr_HalfedgeElement[1])(&local_70);
      BBox::expand(__return_storage_ptr__,&local_70);
    }
    pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                       ((_List_const_iterator<CMU462::Halfedge> *)&f);
    local_80._M_node = (_List_node_base *)Halfedge::twin(pHVar2);
    pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_80);
    local_78 = (_List_node_base *)Halfedge::next(pHVar2);
    f._M_node = local_78;
    local_88._M_node = (_List_node_base *)halfedge(this);
    bVar1 = std::operator!=((_Self *)&f,&local_88);
  } while (bVar1);
  return __return_storage_ptr__;
}

Assistant:

BBox Vertex::bounds() const
  {
    BBox box;

    // grow the bounding box to contain
    // all faces that touch this vertex
    HalfedgeCIter h = halfedge();
    do
    {
      FaceCIter f = h->face();
      if( !f->isBoundary() )
      {
        box.expand( f->bounds() );
      }

      h = h->twin()->next();
    }
    while( h != halfedge() );

    return box;
  }